

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AZHighLevelEncoder.cpp
# Opt level: O3

BitArray * ZXing::Aztec::HighLevelEncoder::Encode(BitArray *__return_storage_ptr__,string *text)

{
  byte bVar1;
  char cVar2;
  pointer pcVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  _List_node_base *p_Var9;
  _List_node_base *p_Var10;
  char cVar11;
  Token *symbol;
  ulong uVar12;
  ulong uVar13;
  EncodingState minState;
  EncodingState stateNoBinary;
  list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_> states;
  undefined1 local_138 [32];
  int local_118;
  undefined1 local_108 [32];
  int local_e8;
  BitArray *local_d8;
  ulong local_d0;
  undefined1 local_c8 [24];
  _List_node_base *p_Stack_b0;
  int local_a8;
  _List_base<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_> local_98;
  undefined8 local_80;
  long local_78;
  ulong local_70;
  _List_base<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_> local_68;
  string *local_50;
  _List_base<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_> local_48;
  
  local_68._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_68;
  local_68._M_impl._M_node._M_size = 0;
  local_d8 = __return_storage_ptr__;
  local_68._M_impl._M_node.super__List_node_base._M_prev =
       local_68._M_impl._M_node.super__List_node_base._M_next;
  p_Var9 = (_List_node_base *)operator_new(0x38);
  p_Var9[2]._M_next = (_List_node_base *)0x0;
  p_Var9[2]._M_prev = (_List_node_base *)0x0;
  p_Var9[1]._M_next = (_List_node_base *)0x0;
  p_Var9[1]._M_prev = (_List_node_base *)0x0;
  *(undefined4 *)&p_Var9[3]._M_next = 0;
  std::__detail::_List_node_base::_M_hook(p_Var9);
  local_68._M_impl._M_node._M_size = local_68._M_impl._M_node._M_size + 1;
  iVar7 = (int)text->_M_string_length;
  if (0 < iVar7) {
    uVar12 = 0;
    local_50 = text;
    do {
      local_80 = (long)(int)uVar12;
      local_78 = local_80 + 1;
      pcVar3 = (text->_M_dataplus)._M_p;
      cVar11 = '\0';
      if ((int)local_78 < iVar7) {
        cVar11 = pcVar3[local_78];
      }
      bVar1 = pcVar3[local_80];
      local_d0 = uVar12;
      if (bVar1 < 0x2e) {
        if (bVar1 == 0xd) {
          iVar7 = 2;
          if (cVar11 == '\n') goto LAB_0014b3a3;
        }
        else if (bVar1 == 0x2c) {
          iVar7 = 4;
          goto LAB_0014b39a;
        }
LAB_0014afe5:
        local_108._16_8_ = (_List_node_base *)0x0;
        p_Var9 = local_68._M_impl._M_node.super__List_node_base._M_next;
        local_108._0_8_ = (_List_node_base *)local_108;
        local_108._8_8_ = (_List_node_base *)local_108;
        if (local_68._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&local_68)
        {
LAB_0014b354:
          std::__cxx11::
          list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>::list
                    ((list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
                      *)&local_98,
                     (list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
                      *)local_108);
        }
        else {
          do {
            uVar12 = (ulong)(byte)(text->_M_dataplus)._M_p[local_80];
            cVar11 = *(char *)(uVar12 + (long)*(int *)&p_Var9[2]._M_prev * 0x100 + CHAR_MAP);
            local_c8._16_8_ = (_List_node_base *)0x0;
            p_Stack_b0 = (_List_node_base *)0x0;
            local_c8._0_8_ = (_List_node_base *)0x0;
            local_c8._8_8_ = (_List_node_base *)0x0;
            local_a8 = 0;
            bVar6 = true;
            uVar13 = 0;
            local_70 = uVar12;
            do {
              cVar2 = *(char *)(CHAR_MAP + uVar12);
              if ('\0' < cVar2) {
                if (bVar6) {
                  EndBinaryShift((EncodingState *)local_138,(EncodingState *)(p_Var9 + 1),
                                 (int)local_d0);
                  uVar5 = local_c8._16_8_;
                  uVar4 = local_c8._0_8_;
                  local_c8._0_8_ = local_138._0_8_;
                  local_c8._8_8_ = local_138._8_8_;
                  local_c8._16_8_ = local_138._16_8_;
                  local_138._0_8_ = (_List_node_base *)0x0;
                  local_138._8_8_ = (_List_node_base *)0x0;
                  local_138._16_8_ = (_List_node_base *)0x0;
                  if ((_List_node_base *)uVar4 == (_List_node_base *)0x0) {
                    local_a8 = local_118;
                    p_Stack_b0 = (_List_node_base *)local_138._24_8_;
                  }
                  else {
                    operator_delete((void *)uVar4,uVar5 - uVar4);
                    local_a8 = local_118;
                    p_Stack_b0 = (_List_node_base *)local_138._24_8_;
                    if ((_List_node_base *)local_138._0_8_ != (_List_node_base *)0x0) {
                      operator_delete((void *)local_138._0_8_,local_138._16_8_ - local_138._0_8_);
                    }
                  }
                }
                if (((cVar11 < '\x01') || (uVar13 == 2)) || (uVar13 == *(uint *)&p_Var9[2]._M_prev))
                {
                  LatchAndAppend((EncodingState *)local_138,(EncodingState *)local_c8,(int)uVar13,
                                 (int)cVar2);
                  p_Var10 = (_List_node_base *)operator_new(0x38);
                  p_Var10[1]._M_next = (_List_node_base *)local_138._0_8_;
                  p_Var10[1]._M_prev = (_List_node_base *)local_138._8_8_;
                  p_Var10[2]._M_next = (_List_node_base *)local_138._16_8_;
                  local_138._0_8_ = (_List_node_base *)0x0;
                  local_138._8_8_ = (_List_node_base *)0x0;
                  local_138._16_8_ = (_List_node_base *)0x0;
                  *(int *)&p_Var10[3]._M_next = local_118;
                  p_Var10[2]._M_prev = (_List_node_base *)local_138._24_8_;
                  std::__detail::_List_node_base::_M_hook(p_Var10);
                  local_108._16_8_ = (long)(_List_node_base **)local_108._16_8_ + 1;
                  if ((_List_node_base *)local_138._0_8_ != (_List_node_base *)0x0) {
                    operator_delete((void *)local_138._0_8_,local_138._16_8_ - local_138._0_8_);
                  }
                  if ((cVar11 < '\x01') &&
                     (-1 < *(char *)(uVar13 + (long)*(int *)&p_Var9[2]._M_prev * 6 + SHIFT_TABLE)))
                  {
                    ShiftAndAppend((EncodingState *)local_138,(EncodingState *)local_c8,(int)uVar13,
                                   (int)cVar2);
                    p_Var10 = (_List_node_base *)operator_new(0x38);
                    p_Var10[1]._M_next = (_List_node_base *)local_138._0_8_;
                    p_Var10[1]._M_prev = (_List_node_base *)local_138._8_8_;
                    p_Var10[2]._M_next = (_List_node_base *)local_138._16_8_;
                    local_138._0_8_ = (_List_node_base *)0x0;
                    local_138._8_8_ = (_List_node_base *)0x0;
                    local_138._16_8_ = (_List_node_base *)0x0;
                    *(int *)&p_Var10[3]._M_next = local_118;
                    p_Var10[2]._M_prev = (_List_node_base *)local_138._24_8_;
                    std::__detail::_List_node_base::_M_hook(p_Var10);
                    local_108._16_8_ = (long)(_List_node_base **)local_108._16_8_ + 1;
                    if ((_List_node_base *)local_138._0_8_ != (_List_node_base *)0x0) {
                      operator_delete((void *)local_138._0_8_,local_138._16_8_ - local_138._0_8_);
                    }
                  }
                }
                bVar6 = false;
              }
              text = local_50;
              uVar13 = uVar13 + 1;
              uVar12 = uVar12 + 0x100;
            } while (uVar13 != 5);
            if ((0 < *(int *)((long)&p_Var9[2]._M_prev + 4)) ||
               (*(char *)(local_70 + (long)*(int *)&p_Var9[2]._M_prev * 0x100 + CHAR_MAP) == '\0'))
            {
              AddBinaryShiftChar((EncodingState *)local_138,(EncodingState *)(p_Var9 + 1),
                                 (int)local_d0);
              p_Var10 = (_List_node_base *)operator_new(0x38);
              p_Var10[1]._M_next = (_List_node_base *)local_138._0_8_;
              p_Var10[1]._M_prev = (_List_node_base *)local_138._8_8_;
              p_Var10[2]._M_next = (_List_node_base *)local_138._16_8_;
              local_138._0_8_ = (_List_node_base *)0x0;
              local_138._8_8_ = (_List_node_base *)0x0;
              local_138._16_8_ = (_List_node_base *)0x0;
              *(int *)&p_Var10[3]._M_next = local_118;
              p_Var10[2]._M_prev = (_List_node_base *)local_138._24_8_;
              std::__detail::_List_node_base::_M_hook(p_Var10);
              local_108._16_8_ = (long)(_List_node_base **)local_108._16_8_ + 1;
              if ((_List_node_base *)local_138._0_8_ != (_List_node_base *)0x0) {
                operator_delete((void *)local_138._0_8_,local_138._16_8_ - local_138._0_8_);
              }
            }
            if ((_List_node_base *)local_c8._0_8_ != (_List_node_base *)0x0) {
              operator_delete((void *)local_c8._0_8_,local_c8._16_8_ - local_c8._0_8_);
            }
            p_Var9 = (((_List_base<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
                        *)&p_Var9->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
          } while (p_Var9 != (_List_node_base *)&local_68);
          if ((ulong)local_108._16_8_ < (_List_node_base *)0x2) goto LAB_0014b354;
          SimplifyStates((list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
                          *)&local_98,
                         (list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
                          *)local_108);
        }
        std::__cxx11::
        _List_base<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>::
        _M_clear((_List_base<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
                  *)local_108);
        std::__cxx11::
        list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>::
        _M_move_assign((list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
                        *)&local_68,&local_98);
        std::__cxx11::
        _List_base<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>::
        _M_clear(&local_98);
        uVar8 = (uint)local_78;
      }
      else {
        if (bVar1 == 0x2e) {
          iVar7 = 3;
        }
        else {
          if (bVar1 != 0x3a) goto LAB_0014afe5;
          iVar7 = 5;
        }
LAB_0014b39a:
        if (cVar11 != ' ') goto LAB_0014afe5;
LAB_0014b3a3:
        local_98._M_impl._M_node._M_size = 0;
        local_98._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_98;
        local_98._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_98;
        if (local_68._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_68)
        {
          local_70 = CONCAT44(local_70._4_4_,iVar7 + -3);
          local_80 = CONCAT44((int)uVar12 >> 0x1f,0x10 - iVar7);
          p_Var9 = local_68._M_impl._M_node.super__List_node_base._M_next;
          do {
            EndBinaryShift((EncodingState *)local_c8,(EncodingState *)(p_Var9 + 1),(int)local_d0);
            LatchAndAppend((EncodingState *)local_138,(EncodingState *)local_c8,4,iVar7);
            p_Var10 = (_List_node_base *)operator_new(0x38);
            p_Var10[1]._M_next = (_List_node_base *)local_138._0_8_;
            p_Var10[1]._M_prev = (_List_node_base *)local_138._8_8_;
            p_Var10[2]._M_next = (_List_node_base *)local_138._16_8_;
            local_138._0_8_ = (_List_node_base *)0x0;
            local_138._8_8_ = (_List_node_base *)0x0;
            local_138._16_8_ = (_List_node_base *)0x0;
            *(int *)&p_Var10[3]._M_next = local_118;
            p_Var10[2]._M_prev = (_List_node_base *)local_138._24_8_;
            std::__detail::_List_node_base::_M_hook(p_Var10);
            local_98._M_impl._M_node._M_size = local_98._M_impl._M_node._M_size + 1;
            if ((_List_node_base *)local_138._0_8_ != (_List_node_base *)0x0) {
              operator_delete((void *)local_138._0_8_,local_138._16_8_ - local_138._0_8_);
            }
            if (*(int *)&p_Var9[2]._M_prev != 4) {
              ShiftAndAppend((EncodingState *)local_138,(EncodingState *)local_c8,4,iVar7);
              p_Var10 = (_List_node_base *)operator_new(0x38);
              p_Var10[1]._M_next = (_List_node_base *)local_138._0_8_;
              p_Var10[1]._M_prev = (_List_node_base *)local_138._8_8_;
              p_Var10[2]._M_next = (_List_node_base *)local_138._16_8_;
              local_138._0_8_ = (_List_node_base *)0x0;
              local_138._8_8_ = (_List_node_base *)0x0;
              local_138._16_8_ = (_List_node_base *)0x0;
              *(int *)&p_Var10[3]._M_next = local_118;
              p_Var10[2]._M_prev = (_List_node_base *)local_138._24_8_;
              std::__detail::_List_node_base::_M_hook(p_Var10);
              local_98._M_impl._M_node._M_size = local_98._M_impl._M_node._M_size + 1;
              if ((_List_node_base *)local_138._0_8_ != (_List_node_base *)0x0) {
                operator_delete((void *)local_138._0_8_,local_138._16_8_ - local_138._0_8_);
              }
            }
            if ((uint)local_70 < 2) {
              LatchAndAppend((EncodingState *)local_138,(EncodingState *)local_c8,2,(int)local_80);
              LatchAndAppend((EncodingState *)local_108,(EncodingState *)local_138,2,1);
              p_Var10 = (_List_node_base *)operator_new(0x38);
              p_Var10[1]._M_next = (_List_node_base *)local_108._0_8_;
              p_Var10[1]._M_prev = (_List_node_base *)local_108._8_8_;
              p_Var10[2]._M_next = (_List_node_base *)local_108._16_8_;
              local_108._0_8_ = (_List_node_base *)0x0;
              local_108._8_8_ = (_List_node_base *)0x0;
              local_108._16_8_ = (_List_node_base *)0x0;
              *(int *)&p_Var10[3]._M_next = local_e8;
              p_Var10[2]._M_prev = (_List_node_base *)local_108._24_8_;
              std::__detail::_List_node_base::_M_hook(p_Var10);
              local_98._M_impl._M_node._M_size = local_98._M_impl._M_node._M_size + 1;
              if ((_List_node_base *)local_108._0_8_ != (_List_node_base *)0x0) {
                operator_delete((void *)local_108._0_8_,local_108._16_8_ - local_108._0_8_);
              }
              if ((_List_node_base *)local_138._0_8_ != (_List_node_base *)0x0) {
                operator_delete((void *)local_138._0_8_,local_138._16_8_ - local_138._0_8_);
              }
            }
            if (0 < *(int *)((long)&p_Var9[2]._M_prev + 4)) {
              AddBinaryShiftChar((EncodingState *)local_108,(EncodingState *)(p_Var9 + 1),
                                 (int)local_d0);
              AddBinaryShiftChar((EncodingState *)local_138,(EncodingState *)local_108,(int)local_78
                                );
              p_Var10 = (_List_node_base *)operator_new(0x38);
              p_Var10[1]._M_next = (_List_node_base *)local_138._0_8_;
              p_Var10[1]._M_prev = (_List_node_base *)local_138._8_8_;
              p_Var10[2]._M_next = (_List_node_base *)local_138._16_8_;
              local_138._0_8_ = (_List_node_base *)0x0;
              local_138._8_8_ = (_List_node_base *)0x0;
              local_138._16_8_ = (_List_node_base *)0x0;
              *(int *)&p_Var10[3]._M_next = local_118;
              p_Var10[2]._M_prev = (_List_node_base *)local_138._24_8_;
              std::__detail::_List_node_base::_M_hook(p_Var10);
              local_98._M_impl._M_node._M_size = local_98._M_impl._M_node._M_size + 1;
              if ((_List_node_base *)local_138._0_8_ != (_List_node_base *)0x0) {
                operator_delete((void *)local_138._0_8_,local_138._16_8_ - local_138._0_8_);
              }
              if ((_List_node_base *)local_108._0_8_ != (_List_node_base *)0x0) {
                operator_delete((void *)local_108._0_8_,local_108._16_8_ - local_108._0_8_);
              }
            }
            if ((_List_node_base *)local_c8._0_8_ != (_List_node_base *)0x0) {
              operator_delete((void *)local_c8._0_8_,local_c8._16_8_ - local_c8._0_8_);
            }
            p_Var9 = p_Var9->_M_next;
          } while (p_Var9 != (_List_node_base *)&local_68);
        }
        SimplifyStates((list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
                        *)&local_48,
                       (list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
                        *)&local_98);
        std::__cxx11::
        _List_base<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>::
        _M_clear(&local_98);
        std::__cxx11::
        list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>::
        _M_move_assign((list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
                        *)&local_68,&local_48);
        std::__cxx11::
        _List_base<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>::
        _M_clear(&local_48);
        uVar8 = (int)local_d0 + 2;
      }
      iVar7 = (int)text->_M_string_length;
      uVar12 = (ulong)uVar8;
    } while ((int)uVar8 < iVar7);
  }
  p_Var9 = local_68._M_impl._M_node.super__List_node_base._M_next;
  if ((local_68._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_68) &&
     (p_Var10 = (((_List_base<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
                   *)&(local_68._M_impl._M_node.super__List_node_base._M_next)->_M_next)->_M_impl).
                _M_node.super__List_node_base._M_next, p_Var10 != (_List_node_base *)&local_68)) {
    do {
      if (*(int *)&(((list<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
                      *)(p_Var10 + 3))->
                   super__List_base<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
                   )._M_impl._M_node.super__List_node_base._M_next <
          *(int *)&(((_List_base<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
                      *)&p_Var9[3]._M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
        p_Var9 = p_Var10;
      }
      p_Var10 = (((_List_base<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
                   *)&p_Var10->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var10 != (_List_node_base *)&local_68);
  }
  std::vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_>::vector
            ((vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_> *)local_138,
             (vector<ZXing::Aztec::Token,_std::allocator<ZXing::Aztec::Token>_> *)(p_Var9 + 1));
  local_118 = *(int *)&(((_List_base<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>
                          *)&p_Var9[3]._M_next)->_M_impl)._M_node.super__List_node_base._M_next;
  local_138._24_8_ = p_Var9[2]._M_prev;
  EndBinaryShift((EncodingState *)local_c8,(EncodingState *)local_138,(int)text->_M_string_length);
  uVar4 = local_c8._8_8_;
  (local_d8->_bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_d8->_bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_d8->_bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (p_Var9 = (_List_node_base *)local_c8._0_8_; p_Var9 != (_List_node_base *)uVar4;
      p_Var9 = (_List_node_base *)((long)&p_Var9->_M_next + 4)) {
    Token::appendTo((Token *)p_Var9,local_d8,text);
  }
  if ((_List_node_base *)local_c8._0_8_ != (_List_node_base *)0x0) {
    operator_delete((void *)local_c8._0_8_,local_c8._16_8_ - local_c8._0_8_);
  }
  if ((_List_node_base *)local_138._0_8_ != (_List_node_base *)0x0) {
    operator_delete((void *)local_138._0_8_,local_138._16_8_ - local_138._0_8_);
  }
  std::__cxx11::
  _List_base<ZXing::Aztec::EncodingState,_std::allocator<ZXing::Aztec::EncodingState>_>::_M_clear
            (&local_68);
  return local_d8;
}

Assistant:

BitArray
HighLevelEncoder::Encode(const std::string& text)
{
	std::list<EncodingState> states;
	states.push_back(EncodingState{ std::vector<Token>(), MODE_UPPER, 0, 0 });
	for (int index = 0; index < Size(text); index++) {
		int pairCode;
		int nextChar = index + 1 < Size(text) ? text[index + 1] : 0;
		switch (text[index]) {
		case '\r': pairCode = nextChar == '\n' ? 2 : 0; break;
		case '.': pairCode = nextChar == ' ' ? 3 : 0; break;
		case ',': pairCode = nextChar == ' ' ? 4 : 0; break;
		case ':': pairCode = nextChar == ' ' ? 5 : 0; break;
		default: pairCode = 0;
		}
		if (pairCode > 0) {
			// We have one of the four special PUNCT pairs.  Treat them specially.
			// Get a new set of states for the two new characters.
			states = UpdateStateListForPair(states, index, pairCode);
			index++;
		} else {
			// Get a new set of states for the new character.
			states = UpdateStateListForChar(states, text, index);
		}
	}
	// We are left with a set of states.  Find the shortest one.
	EncodingState minState = *std::min_element(states.begin(), states.end(), [](const EncodingState& a, const EncodingState& b) { return a.bitCount < b.bitCount; });
	// Convert it to a bit array, and return.
	return ToBitArray(minState, text);
}